

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O2

bool __thiscall CJsonWriter::CanWriteDatatype(CJsonWriter *this)

{
  CState *pCVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->m_NumStates != 0) {
    pCVar1 = TopState(this);
    if (pCVar1->m_Kind != '\x02') {
      pCVar1 = TopState(this);
      bVar2 = pCVar1->m_Kind == '\x03';
    }
  }
  return bVar2;
}

Assistant:

bool CJsonWriter::CanWriteDatatype()
{
	return m_NumStates == 0
		|| TopState()->m_Kind == STATE_ARRAY
		|| TopState()->m_Kind == STATE_ATTRIBUTE;
}